

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

xmlDocPtr parseHtml(xmllintState *lint,char *filename)

{
  xmlParserCtxtPtr pxVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  xmlDocPtr pxVar4;
  ulong uVar5;
  char chars [4096];
  undefined1 auStack_1028 [4096];
  
  pxVar1 = lint->ctxt;
  if (lint->push == 0) {
    if (lint->memory == 0) {
      if ((*filename == '-') && (filename[1] == '\0')) {
        pxVar4 = (xmlDocPtr)htmlCtxtReadFd(pxVar1,0,"-",0,lint->options);
        return pxVar4;
      }
      pxVar4 = (xmlDocPtr)htmlCtxtReadFile(pxVar1,filename,0,lint->options);
      return pxVar4;
    }
    lVar3 = xmlNewInputFromMemory(filename,lint->memoryData,lint->memorySize,6);
    if (lVar3 != 0) {
      pxVar4 = (xmlDocPtr)htmlCtxtParseDocument(pxVar1,lVar3);
      return pxVar4;
    }
    lint->progresult = XMLLINT_ERR_MEM;
    pxVar4 = (xmlDocPtr)0x0;
  }
  else if (((*filename == '-') && (__stream = _stdin, filename[1] == '\0')) ||
          (__stream = fopen64(filename,"rb"), __stream != (FILE *)0x0)) {
    uVar5 = fread(auStack_1028,1,0x1000,__stream);
    iVar2 = (int)uVar5;
    while (0 < iVar2) {
      htmlParseChunk(pxVar1,auStack_1028,uVar5 & 0xffffffff,0);
      uVar5 = fread(auStack_1028,1,0x1000,__stream);
      iVar2 = (int)uVar5;
    }
    htmlParseChunk(pxVar1,auStack_1028,0,1);
    pxVar4 = pxVar1->myDoc;
    pxVar1->myDoc = (xmlDocPtr)0x0;
    if (__stream != _stdin) {
      fclose(__stream);
    }
  }
  else {
    pxVar4 = (xmlDocPtr)0x0;
    fprintf((FILE *)lint->errStream,"Can\'t open %s\n",filename);
    lint->progresult = XMLLINT_ERR_RDFILE;
  }
  return pxVar4;
}

Assistant:

static xmlDocPtr
parseHtml(xmllintState *lint, const char *filename) {
    xmlParserCtxtPtr ctxt = lint->ctxt;
    xmlDocPtr doc;

#ifdef LIBXML_PUSH_ENABLED
    if (lint->push) {
        FILE *f;
        int res;
        char chars[4096];

        if ((filename[0] == '-') && (filename[1] == 0)) {
            f = stdin;
        } else {
	    f = fopen(filename, "rb");
            if (f == NULL) {
                fprintf(lint->errStream, "Can't open %s\n", filename);
                lint->progresult = XMLLINT_ERR_RDFILE;
                return(NULL);
            }
        }

        while ((res = fread(chars, 1, 4096, f)) > 0) {
            htmlParseChunk(ctxt, chars, res, 0);
        }
        htmlParseChunk(ctxt, chars, 0, 1);
        doc = ctxt->myDoc;
        ctxt->myDoc = NULL;
        if (f != stdin)
            fclose(f);

        return(doc);
    }
#endif /* LIBXML_PUSH_ENABLED */

#if HAVE_DECL_MMAP
    if (lint->memory) {
        xmlParserInputPtr input;

        input = xmlNewInputFromMemory(filename,
                                      lint->memoryData, lint->memorySize,
                                      XML_INPUT_BUF_STATIC |
                                      XML_INPUT_BUF_ZERO_TERMINATED);
        if (input == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            return(NULL);
        }
        doc = htmlCtxtParseDocument(ctxt, input);
        return(doc);
    }
#endif

    if (strcmp(filename, "-") == 0)
        doc = htmlCtxtReadFd(ctxt, STDIN_FILENO, "-", NULL,
                             lint->options);
    else
        doc = htmlCtxtReadFile(ctxt, filename, NULL, lint->options);

    return(doc);
}